

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Gia_Man_t *
Acb_NtkToGia(Acb_Ntk_t *p,Vec_Int_t *vSupp,Vec_Int_t *vNodes,Vec_Int_t *vRoots,Vec_Int_t *vDivs,
            Vec_Int_t *vTargets)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *p_01;
  int *piVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  
  p_00 = Gia_ManStart((p->vObjType).nSize * 2 + 0x3e6);
  pcVar3 = Acb_NtkName(p);
  pcVar3 = Abc_UtilStrsav(pcVar3);
  p_00->pName = pcVar3;
  Gia_ManHashAlloc(p_00);
  Vec_IntFill(&p->vObjCopy,(p->vObjType).nCap,-1);
  for (iVar6 = 0; iVar6 < vSupp->nSize; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(vSupp,iVar6);
    iVar1 = Vec_IntEntry(&p->vCis,iVar1);
    iVar2 = Gia_ManAppendCi(p_00);
    Acb_ObjSetCopy(p,iVar1,iVar2);
  }
  if (vTargets != (Vec_Int_t *)0x0) {
    for (iVar6 = 0; iVar6 < vTargets->nSize; iVar6 = iVar6 + 1) {
      iVar1 = Vec_IntEntry(vTargets,iVar6);
      iVar2 = Gia_ManAppendCi(p_00);
      Acb_ObjSetCopy(p,iVar1,iVar2);
    }
  }
  p_01 = Vec_IntAlloc(4);
  for (iVar6 = 0; iVar6 < vNodes->nSize; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(vNodes,iVar6);
    iVar2 = Acb_ObjCopy(p,iVar1);
    if (iVar2 == -1) {
      iVar2 = Acb_ObjToGia(p_00,p,iVar1,p_01);
      Acb_ObjSetCopy(p,iVar1,iVar2);
    }
  }
  Vec_IntFree(p_01);
  for (iVar6 = 0; iVar6 < vRoots->nSize; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(vRoots,iVar6);
    iVar1 = Vec_IntEntry(&p->vCos,iVar1);
    piVar4 = Acb_ObjFanins(p,iVar1);
    iVar1 = Acb_ObjCopy(p,piVar4[1]);
    Gia_ManAppendCo(p_00,iVar1);
  }
  if (vDivs != (Vec_Int_t *)0x0) {
    for (iVar6 = 0; iVar6 < vDivs->nSize; iVar6 = iVar6 + 1) {
      iVar1 = Vec_IntEntry(vDivs,iVar6);
      iVar1 = Acb_ObjCopy(p,iVar1);
      Gia_ManAppendCo(p_00,iVar1);
    }
  }
  Gia_ManHashStop(p_00);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Acb_NtkToGia( Acb_Ntk_t * p, Vec_Int_t * vSupp, Vec_Int_t * vNodes, Vec_Int_t * vRoots, Vec_Int_t * vDivs, Vec_Int_t * vTargets )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Gia_ManHashAlloc( pNew );
    Acb_NtkCleanObjCopies( p );
    // create primary inputs
    Acb_NtkForEachCiVec( vSupp, p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    // add targets as primary inputs
    if ( vTargets )
        Vec_IntForEachEntry( vTargets, iObj, i )
            Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    // bit-blast internal nodes
    vFanins = Vec_IntAlloc( 4 );
    Vec_IntForEachEntry( vNodes, iObj, i )
        if ( Acb_ObjCopy(p, iObj) == -1 ) // skip targets assigned above
            Acb_ObjSetCopy( p, iObj, Acb_ObjToGia(pNew, p, iObj, vFanins) );
    Vec_IntFree( vFanins );
    // create primary outputs
    Acb_NtkForEachCoDriverVec( vRoots, p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, iObj) );
    // add divisor as primary outputs (if the divisors are not primary inputs)
    if ( vDivs )//&& Vec_IntSize(vDivs) > Vec_IntSize(vSupp) ) 
        Vec_IntForEachEntry( vDivs, iObj, i )
            Gia_ManAppendCo( pNew, Acb_ObjCopy(p, iObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}